

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_decoder.hpp
# Opt level: O3

void andyzip::brotli_decoder::inverse_move_to_front(uint8_t *values,int num_values)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint8_t uVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  uint8_t uVar16;
  uint8_t uVar17;
  uint8_t uVar18;
  uint8_t uVar19;
  uint8_t uVar20;
  uint8_t uVar21;
  uint8_t local_108 [264];
  
  uVar6 = '\0';
  uVar7 = '\x01';
  uVar8 = '\x02';
  uVar9 = '\x03';
  uVar10 = '\x04';
  uVar11 = '\x05';
  uVar12 = '\x06';
  uVar13 = '\a';
  uVar14 = '\b';
  uVar15 = '\t';
  uVar16 = '\n';
  uVar17 = '\v';
  uVar18 = '\f';
  uVar19 = '\r';
  uVar20 = '\x0e';
  uVar21 = '\x0f';
  lVar1 = 0;
  do {
    local_108[lVar1] = uVar6;
    local_108[lVar1 + 1] = uVar7;
    local_108[lVar1 + 2] = uVar8;
    local_108[lVar1 + 3] = uVar9;
    local_108[lVar1 + 4] = uVar10;
    local_108[lVar1 + 5] = uVar11;
    local_108[lVar1 + 6] = uVar12;
    local_108[lVar1 + 7] = uVar13;
    local_108[lVar1 + 8] = uVar14;
    local_108[lVar1 + 9] = uVar15;
    local_108[lVar1 + 10] = uVar16;
    local_108[lVar1 + 0xb] = uVar17;
    local_108[lVar1 + 0xc] = uVar18;
    local_108[lVar1 + 0xd] = uVar19;
    local_108[lVar1 + 0xe] = uVar20;
    local_108[lVar1 + 0xf] = uVar21;
    lVar1 = lVar1 + 0x10;
    uVar6 = uVar6 + '\x10';
    uVar7 = uVar7 + '\x10';
    uVar8 = uVar8 + '\x10';
    uVar9 = uVar9 + '\x10';
    uVar10 = uVar10 + '\x10';
    uVar11 = uVar11 + '\x10';
    uVar12 = uVar12 + '\x10';
    uVar13 = uVar13 + '\x10';
    uVar14 = uVar14 + '\x10';
    uVar15 = uVar15 + '\x10';
    uVar16 = uVar16 + '\x10';
    uVar17 = uVar17 + '\x10';
    uVar18 = uVar18 + '\x10';
    uVar19 = uVar19 + '\x10';
    uVar20 = uVar20 + '\x10';
    uVar21 = uVar21 + '\x10';
  } while (lVar1 != 0x100);
  if (0 < num_values) {
    uVar2 = 0;
    do {
      uVar3 = (ulong)values[uVar2];
      local_108[0] = local_108[uVar3];
      values[uVar2] = local_108[0];
      if (uVar3 != 0) {
        uVar4 = uVar3 + 0xffffffff;
        do {
          uVar5 = uVar3 - 1;
          local_108[uVar3] = local_108[uVar4 & 0xffffffff];
          uVar4 = uVar4 - 1;
          uVar3 = uVar5;
        } while ((char)uVar5 != '\0');
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)num_values);
  }
  return;
}

Assistant:

static void inverse_move_to_front(uint8_t values[], int num_values) {
      uint8_t mtf[256];
      for (int i = 0; i < 256; ++i) {
        mtf[i] = (uint8_t)i;
      }
      for (int i = 0; i < num_values; ++i) {
        uint8_t index = values[i];
        uint8_t value = mtf[index];
        values[i] = value;
        for (; index; --index) {
          mtf[index] = mtf[index - 1];
        }
        mtf[0] = value;
      }
    }